

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inquire.cpp
# Opt level: O0

bool fs_is_fifo(string_view path)

{
  bool bVar1;
  byte local_59;
  path local_58;
  undefined1 local_30 [8];
  error_code ec;
  undefined1 auStack_18 [7];
  bool ok;
  string_view path_local;
  
  path_local._M_len = (size_t)path._M_str;
  _auStack_18 = path._M_len;
  std::error_code::error_code((error_code *)local_30);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_58,(basic_string_view<char,_std::char_traits<char>_> *)auStack_18,auto_format);
  bVar1 = std::filesystem::is_fifo(&local_58,(error_code *)local_30);
  local_59 = 0;
  if (bVar1) {
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_30);
    local_59 = bVar1 ^ 0xff;
  }
  ec._M_cat._7_1_ = local_59 & 1;
  std::filesystem::__cxx11::path::~path(&local_58);
  return (bool)(ec._M_cat._7_1_ & 1);
}

Assistant:

bool
fs_is_fifo(std::string_view path)
{
  // mkfifo() or CreateNamedPipe()
  bool ok;

#if defined(_WIN32)
  ok = fs_win32_is_type(path, FILE_TYPE_PIPE);
#elif defined(HAVE_CXX_FILESYSTEM)
  std::error_code ec;
  ok = std::filesystem::is_fifo(path, ec) && !ec;
#else
  ok = S_ISFIFO(fs_st_mode(path));
#endif

  return ok;
}